

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_matcher.hpp
# Opt level: O2

Path * __thiscall
PathMatcher<int>::create_path
          (PathMatcher<int> *this,
          vector<PathMatcher<int>::Path_*,_std::allocator<PathMatcher<int>::Path_*>_> *parent,
          char character,optional<int> value)

{
  Path *route;
  
  route = (Path *)operator_new(0x28);
  route->character = character;
  (route->children).
  super__Vector_base<PathMatcher<int>::Path_*,_std::allocator<PathMatcher<int>::Path_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (route->children).
  super__Vector_base<PathMatcher<int>::Path_*,_std::allocator<PathMatcher<int>::Path_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (route->children).
  super__Vector_base<PathMatcher<int>::Path_*,_std::allocator<PathMatcher<int>::Path_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (route->result).super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
       = (_Optional_payload_base<int>)
         value.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>;
  std::vector<PathMatcher<int>::Path_*,_std::allocator<PathMatcher<int>::Path_*>_>::push_back
            (parent,&route);
  return route;
}

Assistant:

Path *create_path(std::vector<Path *> &parent, char character, std::optional<Result> value) {
        Path *route = new Path(character, value);
        parent.push_back(route);
        return route;
    }